

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

char * unshield_get_last_path_separator(char *path)

{
  char *pcVar1;
  
  pcVar1 = strrchr(path,0x2f);
  return pcVar1;
}

Assistant:

char *unshield_get_last_path_separator(char *path)
{
  char *p = strrchr(path, '/');

#ifdef WIN32
  char *pbs = strrchr(path, '\\');

  if (NULL != pbs && (NULL == p || pbs > p))
    return pbs;
#endif

  return p;
}